

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  bool bVar1;
  ulong uVar2;
  bool local_7a;
  FilePath local_58;
  undefined1 local_38 [8];
  FilePath parent;
  FilePath *this_local;
  
  parent.pathname_.field_2._8_8_ = this;
  bVar1 = IsDirectory(this);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) != 0) || (bVar1 = DirectoryExists(this), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      RemoveTrailingPathSeparator(&local_58,this);
      RemoveFileName((FilePath *)local_38,&local_58);
      ~FilePath(&local_58);
      bVar1 = CreateDirectoriesRecursively((FilePath *)local_38);
      local_7a = false;
      if (bVar1) {
        local_7a = CreateFolder(this);
      }
      this_local._7_1_ = local_7a;
      ~FilePath((FilePath *)local_38);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.empty() || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}